

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O0

void lj_ccallback_leave(CTState *cts,TValue *o)

{
  lua_State *in_RSI;
  long in_RDI;
  GCproto *pt;
  TValue *obase;
  GCfunc *fn;
  lua_State *L;
  TValue *o_00;
  lua_State *in_stack_ffffffffffffffe0;
  CTState *cts_00;
  
  cts_00 = *(CTState **)(in_RDI + 0x10);
  o_00 = (TValue *)cts_00->L;
  cts_00->L = (lua_State *)cts_00->g;
  if ((cts_00->L <= in_RSI) &&
     (in_stack_ffffffffffffffe0 = (lua_State *)(ulong)cts_00->L[-1].stacksize,
     in_stack_ffffffffffffffe0->dummy_ffid == '\0')) {
    *(uint *)((long)(cts_00->cb).fpr[0] + 0x1c) =
         *(uint *)&in_stack_ffffffffffffffe0->base +
         *(int *)((ulong)*(uint *)&in_stack_ffffffffffffffe0->base - 0x38) * 4 + 4;
  }
  callback_conv_result(cts_00,in_stack_ffffffffffffffe0,o_00);
  (cts_00->cb).fpr[0] = *(FPRCBArg *)((long)(cts_00->cb).fpr[0] + 0x20);
  cts_00->g = (global_State *)(cts_00->g[-1].gcroot + 0x22);
  cts_00->L = (lua_State *)o_00;
  *(undefined4 *)(in_RDI + 0xd0) = 0;
  return;
}

Assistant:

void LJ_FASTCALL lj_ccallback_leave(CTState *cts, TValue *o)
{
  lua_State *L = cts->L;
  GCfunc *fn;
  TValue *obase = L->base;
  L->base = L->top;  /* Keep continuation frame for throwing errors. */
  if (o >= L->base) {
    /* PC of RET* is lost. Point to last line for result conv. errors. */
    fn = curr_func(L);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      setcframe_pc(L->cframe, proto_bc(pt)+pt->sizebc+1);
    }
  }
  callback_conv_result(cts, L, o);
  /* Finally drop C frame and continuation frame. */
  L->cframe = cframe_prev(L->cframe);
  L->top -= 2;
  L->base = obase;
  cts->cb.slot = 0;  /* Blacklist C function that called the callback. */
}